

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

_Bool array_container_contains(array_container_t *arr,uint16_t pos)

{
  ushort uVar1;
  int iVar2;
  uint16_t v;
  int i;
  uint16_t middleValue;
  int32_t middleIndex;
  int32_t high;
  uint16_t *carr;
  int32_t low;
  uint16_t pos_local;
  array_container_t *arr_local;
  
  low = 0;
  high = arr->cardinality + -1;
  while (low + 0x10 <= high) {
    iVar2 = low + high >> 1;
    uVar1 = arr->array[iVar2];
    if (uVar1 < pos) {
      low = iVar2 + 1;
    }
    else {
      if (uVar1 <= pos) {
        return true;
      }
      high = iVar2 + -1;
    }
  }
  i = low;
  while( true ) {
    if (high < i) {
      return false;
    }
    uVar1 = arr->array[i];
    if (uVar1 == pos) break;
    if (pos < uVar1) {
      return false;
    }
    i = i + 1;
  }
  return true;
}

Assistant:

inline bool array_container_contains(const array_container_t *arr,
                                     uint16_t pos) {
    //    return binarySearch(arr->array, arr->cardinality, pos) >= 0;
    // binary search with fallback to linear search for short ranges
    int32_t low = 0;
    const uint16_t *carr = (const uint16_t *)arr->array;
    int32_t high = arr->cardinality - 1;
    //    while (high - low >= 0) {
    while (high >= low + 16) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = carr[middleIndex];
        if (middleValue < pos) {
            low = middleIndex + 1;
        } else if (middleValue > pos) {
            high = middleIndex - 1;
        } else {
            return true;
        }
    }

    for (int i = low; i <= high; i++) {
        uint16_t v = carr[i];
        if (v == pos) {
            return true;
        }
        if (v > pos) return false;
    }
    return false;
}